

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineOutputFile.cpp
# Opt level: O2

int __thiscall Imf_3_4::DeepScanLineOutputFile::currentScanLine(DeepScanLineOutputFile *this)

{
  int iVar1;
  pthread_mutex_t *__mutex;
  
  __mutex = (pthread_mutex_t *)this->_data->_streamData;
  std::mutex::lock((mutex *)&__mutex->__data);
  iVar1 = this->_data->currentScanLine;
  pthread_mutex_unlock(__mutex);
  return iVar1;
}

Assistant:

int
DeepScanLineOutputFile::currentScanLine () const
{
#if ILMTHREAD_THREADING_ENABLED
    std::lock_guard<std::mutex> lock (*_data->_streamData);
#endif
    return _data->currentScanLine;
}